

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

RenderTexture2D * LoadRenderTexture(RenderTexture2D *__return_storage_ptr__,int width,int height)

{
  _Bool _Var1;
  uint id;
  uint texId;
  uint texId_00;
  
  *(undefined8 *)&(__return_storage_ptr__->texture).format = 0;
  (__return_storage_ptr__->depth).width = 0;
  (__return_storage_ptr__->depth).height = 0;
  (__return_storage_ptr__->texture).id = 0;
  (__return_storage_ptr__->texture).width = 0;
  (__return_storage_ptr__->texture).height = 0;
  (__return_storage_ptr__->texture).mipmaps = 0;
  (__return_storage_ptr__->depth).mipmaps = 0;
  (__return_storage_ptr__->depth).format = 0;
  id = rlLoadFramebuffer();
  __return_storage_ptr__->id = id;
  if (id == 0) {
    TraceLog(4,"FBO: Framebuffer object can not be created");
  }
  else {
    rlEnableFramebuffer(id);
    texId = rlLoadTexture((void *)0x0,width,height,7,1);
    (__return_storage_ptr__->texture).id = texId;
    (__return_storage_ptr__->texture).width = width;
    (__return_storage_ptr__->texture).height = height;
    (__return_storage_ptr__->texture).mipmaps = 1;
    (__return_storage_ptr__->texture).format = 7;
    texId_00 = rlLoadTextureDepth(width,height,true);
    (__return_storage_ptr__->depth).id = texId_00;
    (__return_storage_ptr__->depth).width = width;
    (__return_storage_ptr__->depth).height = height;
    (__return_storage_ptr__->depth).mipmaps = 1;
    (__return_storage_ptr__->depth).format = 0x13;
    rlFramebufferAttach(id,texId,0,100,0);
    rlFramebufferAttach(id,texId_00,100,200,0);
    _Var1 = rlFramebufferComplete(id);
    if (_Var1) {
      TraceLog(3,"FBO: [ID %i] Framebuffer object created successfully",(ulong)id);
    }
    rlDisableFramebuffer();
  }
  return __return_storage_ptr__;
}

Assistant:

RenderTexture2D LoadRenderTexture(int width, int height)
{
    RenderTexture2D target = { 0 };

    target.id = rlLoadFramebuffer(); // Load an empty framebuffer

    if (target.id > 0)
    {
        rlEnableFramebuffer(target.id);

        // Create color texture (default to RGBA)
        target.texture.id = rlLoadTexture(NULL, width, height, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8, 1);
        target.texture.width = width;
        target.texture.height = height;
        target.texture.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
        target.texture.mipmaps = 1;

        // Create depth renderbuffer/texture
        target.depth.id = rlLoadTextureDepth(width, height, true);
        target.depth.width = width;
        target.depth.height = height;
        target.depth.format = 19;       //DEPTH_COMPONENT_24BIT?
        target.depth.mipmaps = 1;

        // Attach color texture and depth renderbuffer/texture to FBO
        rlFramebufferAttach(target.id, target.texture.id, RL_ATTACHMENT_COLOR_CHANNEL0, RL_ATTACHMENT_TEXTURE2D, 0);
        rlFramebufferAttach(target.id, target.depth.id, RL_ATTACHMENT_DEPTH, RL_ATTACHMENT_RENDERBUFFER, 0);

        // Check if fbo is complete with attachments (valid)
        if (rlFramebufferComplete(target.id)) TRACELOG(LOG_INFO, "FBO: [ID %i] Framebuffer object created successfully", target.id);

        rlDisableFramebuffer();
    }
    else TRACELOG(LOG_WARNING, "FBO: Framebuffer object can not be created");

    return target;
}